

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateScatterLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  uint32 uVar4;
  Tensor *pTVar5;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  allocator<char> local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  string err;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,3,3);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  Result::~Result(__return_storage_ptr__);
  err.field_2._M_local_buf[0xf] = '\0';
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    err.field_2._M_local_buf[0xf] = '\x01';
  }
  if ((err.field_2._M_local_buf[0xf] & 1U) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  if ((this->ndArrayInterpretation & 1U) == 0) goto LAB_00499bc4;
  std::__cxx11::string::string((string *)local_60);
  iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(layer);
  if (iVar2 < 1) {
LAB_0049993a:
    iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(layer);
    if ((iVar2 < 1) ||
       (iVar2 = Specification::NeuralNetworkLayer::outputtensor_size(layer), iVar2 < 1)) {
LAB_00499b9c:
      bVar1 = false;
    }
    else {
      iVar2 = Specification::NeuralNetworkLayer::outputtensor_size(layer);
      if (iVar2 == 1) {
        pTVar5 = Specification::NeuralNetworkLayer::inputtensor(layer,0);
        uVar3 = Specification::Tensor::rank(pTVar5);
        pTVar5 = Specification::NeuralNetworkLayer::outputtensor(layer,0);
        uVar4 = Specification::Tensor::rank(pTVar5);
        if (uVar3 == uVar4) goto LAB_00499b9c;
        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::__cxx11::string::string((string *)&local_170,(string *)psVar6);
        std::operator+(&local_150,"Output rank of Scatter layer \'",&local_170);
        std::operator+(&local_130,&local_150,"\' does not match container input.");
        std::__cxx11::string::operator=((string *)local_60,(string *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
        bVar1 = true;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"Scatter layer must have 1 output tensor fields filled",
                   &local_109);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
        bVar1 = true;
      }
    }
  }
  else {
    iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(layer);
    if (iVar2 == 3) {
      pTVar5 = Specification::NeuralNetworkLayer::inputtensor(layer,0);
      uVar3 = Specification::Tensor::rank(pTVar5);
      pTVar5 = Specification::NeuralNetworkLayer::inputtensor(layer,2);
      uVar4 = Specification::Tensor::rank(pTVar5);
      if (uVar3 == uVar4) {
        pTVar5 = Specification::NeuralNetworkLayer::inputtensor(layer,1);
        uVar3 = Specification::Tensor::rank(pTVar5);
        if (uVar3 == 1) goto LAB_0049993a;
      }
      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
      std::__cxx11::string::string((string *)&local_e8,(string *)psVar6);
      std::operator+(&local_c8,"Input ranks of Scatter layer \'",&local_e8);
      std::operator+(&local_a8,&local_c8,"\' are invalid.");
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
      bVar1 = true;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"Scatter layer must have 3 input tensor fields filled",
                 &local_81);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      bVar1 = true;
    }
  }
  std::__cxx11::string::~string((string *)local_60);
  if (bVar1) {
    return __return_storage_ptr__;
  }
LAB_00499bc4:
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateScatterLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 3, 3));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        std::string err;
        if (layer.inputtensor_size() > 0) {
            if (layer.inputtensor_size() != 3) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Scatter layer must have 3 input tensor fields filled");
            }
            if (!(layer.inputtensor(0).rank() == layer.inputtensor(2).rank() &&
                  layer.inputtensor(1).rank() == 1)) {
                err = "Input ranks of Scatter layer '" + std::string(layer.name()) + "' are invalid.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            if (layer.outputtensor_size() != 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Scatter layer must have 1 output tensor fields filled");
            }
            if (!(layer.inputtensor(0).rank() == layer.outputtensor(0).rank())) {
                err = "Output rank of Scatter layer '" + std::string(layer.name()) + "' does not match container input.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return Result();
}